

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

AttributeSpecSyntax * __thiscall slang::parsing::Parser::parseAttributeSpec(Parser *this)

{
  bool bVar1;
  ExpressionSyntax *expr;
  EqualsValueClauseSyntax *value;
  AttributeSpecSyntax *pAVar2;
  Token name;
  Token equals;
  
  name = ParserBase::expect(&this->super_ParserBase,Identifier);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Equals);
  if (bVar1) {
    equals = ParserBase::consume(&this->super_ParserBase);
    expr = parseExpression(this);
    value = slang::syntax::SyntaxFactory::equalsValueClause(&this->factory,equals,expr);
  }
  else {
    value = (EqualsValueClauseSyntax *)0x0;
  }
  pAVar2 = slang::syntax::SyntaxFactory::attributeSpec(&this->factory,name,value);
  return pAVar2;
}

Assistant:

AttributeSpecSyntax& Parser::parseAttributeSpec() {
    auto name = expect(TokenKind::Identifier);

    EqualsValueClauseSyntax* initializer = nullptr;
    if (peek(TokenKind::Equals)) {
        auto equals = consume();
        initializer = &factory.equalsValueClause(equals, parseExpression());
    }

    return factory.attributeSpec(name, initializer);
}